

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::StateInteractionCase::logProgramInfoLog
          (StateInteractionCase *this,Functions *gl,GLuint program)

{
  glGetProgramInfoLogFunc p_Var1;
  GLuint GVar2;
  int iVar3;
  GLenum err;
  reference pvVar4;
  MessageBuilder *pMVar5;
  reference local_1f0;
  MessageBuilder local_1e8;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> infoLogBuf;
  GLsizei length;
  GLsizei bufSize;
  GLint value;
  TestLog *log;
  Functions *pFStack_18;
  GLuint program_local;
  Functions *gl_local;
  StateInteractionCase *this_local;
  
  log._4_4_ = program;
  pFStack_18 = gl;
  gl_local = (Functions *)this;
  _bufSize = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  length = 0;
  infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  (*pFStack_18->getProgramiv)(log._4_4_,0x8b84,&length);
  iVar3 = length + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_50,(long)iVar3,&local_51);
  std::allocator<char>::~allocator(&local_51);
  GVar2 = log._4_4_;
  p_Var1 = pFStack_18->getProgramInfoLog;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,0);
  (*p_Var1)(GVar2,0,(GLsizei *)
                    &infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14,
            pvVar4);
  err = (*pFStack_18->getError)();
  glu::checkError(err,"GetProgramInfoLog failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x7dd);
  tcu::TestLog::operator<<(&local_1e8,_bufSize,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [14])"Program Log:\n");
  local_1f0 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_50,0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f0);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  return;
}

Assistant:

void logProgramInfoLog(const glw::Functions& gl, glw::GLuint program)
	{
		TestLog&	 log	 = m_testCtx.getLog();
		glw::GLint   value   = 0;
		glw::GLsizei bufSize = 0;
		glw::GLsizei length  = 0;

		gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &value);
		std::vector<char> infoLogBuf(value + 1);

		gl.getProgramInfoLog(program, bufSize, &length, &infoLogBuf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog failed");

		log << TestLog::Message << "Program Log:\n" << &infoLogBuf[0] << TestLog::EndMessage;
	}